

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O2

RuleBuilder * __thiscall Potassco::RuleBuilder::end(RuleBuilder *this,AbstractProgram *out)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  Sum_t local_58;
  AtomSpan local_40;
  
  puVar2 = (uint *)(this->mem_).beg_;
  *puVar2 = *puVar2 | 0x80000000;
  if (out != (AbstractProgram *)0x0) {
    uVar3 = puVar2[1] >> 0x1e;
    if (uVar3 == 2) {
      puVar2 = (uint *)bound_(this);
      uVar3 = *puVar2;
      sum(&local_58,this);
      (*out->_vptr_AbstractProgram[6])(out,(ulong)uVar3,&local_58);
    }
    else if (puVar2[3] < 0x40000000) {
      local_58.lits = (WeightLitSpan)head(this);
      local_40 = (AtomSpan)body(this);
      (*out->_vptr_AbstractProgram[4])(out,(ulong)uVar3,&local_58);
    }
    else {
      local_40 = head(this);
      puVar2 = (uint *)bound_(this);
      uVar1 = *puVar2;
      sum(&local_58,this);
      (*out->_vptr_AbstractProgram[5])(out,(ulong)uVar3,&local_40,(ulong)uVar1,&local_58);
    }
  }
  return this;
}

Assistant:

RuleBuilder& RuleBuilder::end(AbstractProgram* out) {
	Rule* r = rule_();
	r->fix  = 1;
	if (!out) { return *this; }
	if (r->head.type != Directive_t::Minimize && r->body.type == Body_t::Normal) {
		out->rule(static_cast<Head_t>(r->head.type), head(), body());
	}
	else {
		if   (r->head.type != Directive_t::Minimize) { out->rule(static_cast<Head_t>(r->head.type), head(), *bound_(), sum().lits); }
		else                                         { out->minimize(*bound_(), sum().lits); }
	}
	return *this;
}